

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O0

void start_pass_main(j_decompress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_d_main_controller *pjVar1;
  int in_ESI;
  j_decompress_ptr in_RDI;
  my_main_ptr_conflict main_ptr;
  
  pjVar1 = in_RDI->main;
  if (in_ESI == 0) {
    if (in_RDI->upsample->need_context_rows == 0) {
      pjVar1->process_data = process_data_simple_main;
    }
    else {
      pjVar1->process_data = process_data_context_main;
      make_funny_pointers(in_RDI);
      *(undefined4 *)&pjVar1[7].process_data = 0;
      *(undefined4 *)((long)&pjVar1[7].process_data + 4) = 0;
      *(undefined4 *)((long)&pjVar1[8].start_pass + 4) = 0;
    }
    *(undefined4 *)&pjVar1[6].start_pass = 0;
    *(undefined4 *)((long)&pjVar1[6].start_pass + 4) = 0;
  }
  else if (in_ESI == 2) {
    pjVar1->process_data = process_data_crank_post;
  }
  else {
    in_RDI->err->msg_code = 4;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_main(j_compress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  /* Do nothing in raw-data mode. */
  if (cinfo->raw_data_in)
    return;

  if (pass_mode != JBUF_PASS_THRU)
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  main_ptr->cur_iMCU_row = 0;   /* initialize counters */
  main_ptr->rowgroup_ctr = 0;
  main_ptr->suspended = FALSE;
  main_ptr->pass_mode = pass_mode;      /* save mode for use by process_data */
  main_ptr->pub.process_data = process_data_simple_main;
}